

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingReporter.cpp
# Opt level: O2

void __thiscall jaegertracing::reporters::LoggingReporter::report(LoggingReporter *this,Span *span)

{
  Logger *pLVar1;
  ostream *out;
  ostringstream oss;
  string asStack_1a8 [32];
  ostream local_188;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  out = std::operator<<(&local_188,"Reporting span ");
  Span::print<std::ostream>(span,out);
  pLVar1 = this->_logger;
  std::__cxx11::stringbuf::str();
  (*pLVar1->_vptr_Logger[3])(pLVar1,asStack_1a8);
  std::__cxx11::string::~string(asStack_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  return;
}

Assistant:

void LoggingReporter::report(const Span& span) noexcept
{
    std::ostringstream oss;
    oss << "Reporting span " << span;
    _logger.info(oss.str());
}